

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * __thiscall
fmt::v8::detail::
format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
::on_format_specs(format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
                  *this,int id,char *begin,char *param_3)

{
  size_t *psVar1;
  long lVar2;
  char *pcVar3;
  
  pcVar3 = (this->context_).super_basic_format_parse_context<char,_fmt::v8::detail::error_handler>.
           format_str_.data_;
  lVar2 = (long)begin - (long)pcVar3;
  if (lVar2 < 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/core.h"
                ,0x1aa,"negative value");
  }
  (this->context_).super_basic_format_parse_context<char,_fmt::v8::detail::error_handler>.
  format_str_.data_ = pcVar3 + lVar2;
  psVar1 = &(this->context_).super_basic_format_parse_context<char,_fmt::v8::detail::error_handler>.
            format_str_.size_;
  *psVar1 = *psVar1 - lVar2;
  if ((uint)id < 2) {
    pcVar3 = (*this->parse_funcs_[(uint)id])(&this->context_);
    return pcVar3;
  }
  return begin;
}

Assistant:

constexpr auto begin() const FMT_NOEXCEPT -> iterator { return data_; }